

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_dalloc_bin_locked_impl
               (tsdn_t *tsdn,arena_t *arena,bin_t *bin,szind_t binind,extent_t *slab,void *ptr,
               _Bool junked)

{
  size_t *psVar1;
  uint64_t *puVar2;
  ulong *puVar3;
  uint uVar4;
  ulong uVar5;
  bin_t *bin_00;
  ulong uVar6;
  ulong uVar7;
  
  if ((!junked) && (opt_junk_free)) {
    memset(ptr,0x5a,bin_infos[binind].reg_size);
  }
  uVar5 = slab->e_bits;
  uVar6 = uVar5 >> 0x12 & 0xff;
  uVar7 = (ulong)arena_binind_div_info[uVar6].magic * ((long)ptr - (long)slab->e_addr);
  bin_00 = (bin_t *)(uVar7 >> 0x20);
  puVar3 = (ulong *)((long)&slab->field_5 + (uVar7 >> 0x26) * 8);
  *puVar3 = *puVar3 ^ 1L << ((byte)(uVar7 >> 0x20) & 0x3f);
  uVar5 = uVar5 + 0x4000000;
  slab->e_bits = uVar5;
  uVar4 = (uint)(uVar5 >> 0x1a) & 0x3ff;
  if (uVar4 == bin_infos[binind].nregs) {
    if (bin->slabcur == slab) {
      bin->slabcur = (extent_t *)0x0;
    }
    else if (bin_infos[uVar6].nregs == 1) {
      arena_bin_slabs_full_remove(arena,bin,slab);
    }
    else {
      extent_heap_remove(&bin->slabs_nonfull,slab);
      psVar1 = &(bin->stats).nonfull_slabs;
      *psVar1 = *psVar1 - 1;
    }
    arena_dalloc_bin_slab(tsdn,arena,slab,bin);
  }
  else if ((uVar4 == 1) && (bin->slabcur != slab)) {
    arena_bin_slabs_full_remove(arena,bin,slab);
    arena_bin_lower_slab((tsdn_t *)arena,(arena_t *)slab,(extent_t *)bin,bin_00);
  }
  puVar2 = &(bin->stats).ndalloc;
  *puVar2 = *puVar2 + 1;
  psVar1 = &(bin->stats).curregs;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

static void
arena_dalloc_bin_locked_impl(tsdn_t *tsdn, arena_t *arena, bin_t *bin,
    szind_t binind, extent_t *slab, void *ptr, bool junked) {
	arena_slab_data_t *slab_data = extent_slab_data_get(slab);
	const bin_info_t *bin_info = &bin_infos[binind];

	if (!junked && config_fill && unlikely(opt_junk_free)) {
		arena_dalloc_junk_small(ptr, bin_info);
	}

	arena_slab_reg_dalloc(slab, slab_data, ptr);
	unsigned nfree = extent_nfree_get(slab);
	if (nfree == bin_info->nregs) {
		arena_dissociate_bin_slab(arena, slab, bin);
		arena_dalloc_bin_slab(tsdn, arena, slab, bin);
	} else if (nfree == 1 && slab != bin->slabcur) {
		arena_bin_slabs_full_remove(arena, bin, slab);
		arena_bin_lower_slab(tsdn, arena, slab, bin);
	}

	if (config_stats) {
		bin->stats.ndalloc++;
		bin->stats.curregs--;
	}
}